

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Initialize(ImGuiContext *context)

{
  ImGuiID IVar1;
  ImGuiViewportP *viewport;
  ImGuiSettingsHandler local_58;
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    local_58.WriteAllFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
    local_58.UserData = (void *)0x0;
    local_58.ReadLineFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
    local_58.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_58.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_58.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
    local_58.TypeHash = 0;
    local_58._12_4_ = 0;
    local_58.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_58.TypeName = "Window";
    IVar1 = ImHashStr("Window",0,0);
    local_58.TypeHash = IVar1;
    local_58.ClearAllFn = WindowSettingsHandler_ClearAll;
    local_58.ReadOpenFn = WindowSettingsHandler_ReadOpen;
    local_58.ReadLineFn = WindowSettingsHandler_ReadLine;
    local_58.ApplyAllFn = WindowSettingsHandler_ApplyAll;
    local_58.WriteAllFn = WindowSettingsHandler_WriteAll;
    ImVector<ImGuiSettingsHandler>::push_back(&context->SettingsHandlers,&local_58);
    TableSettingsInstallHandler(context);
    local_58.TypeName = (char *)MemAlloc(0xb0);
    local_58.TypeName[0x20] = '\0';
    local_58.TypeName[0x21] = '\0';
    local_58.TypeName[0x22] = '\0';
    local_58.TypeName[0x23] = '\0';
    local_58.TypeName[0] = '\0';
    local_58.TypeName[1] = '\0';
    local_58.TypeName[2] = '\0';
    local_58.TypeName[3] = '\0';
    local_58.TypeName[4] = '\0';
    local_58.TypeName[5] = '\0';
    local_58.TypeName[6] = '\0';
    local_58.TypeName[7] = '\0';
    local_58.TypeName[8] = '\0';
    local_58.TypeName[9] = '\0';
    local_58.TypeName[10] = '\0';
    local_58.TypeName[0xb] = '\0';
    local_58.TypeName[0xc] = '\0';
    local_58.TypeName[0xd] = '\0';
    local_58.TypeName[0xe] = '\0';
    local_58.TypeName[0xf] = '\0';
    local_58.TypeName[0x10] = '\0';
    local_58.TypeName[0x11] = '\0';
    local_58.TypeName[0x12] = '\0';
    local_58.TypeName[0x13] = '\0';
    local_58.TypeName[0x14] = '\0';
    local_58.TypeName[0x15] = '\0';
    local_58.TypeName[0x16] = '\0';
    local_58.TypeName[0x17] = '\0';
    local_58.TypeName[0x18] = '\0';
    local_58.TypeName[0x19] = '\0';
    local_58.TypeName[0x1a] = '\0';
    local_58.TypeName[0x1b] = '\0';
    local_58.TypeName[0x1c] = '\0';
    local_58.TypeName[0x1d] = '\0';
    local_58.TypeName[0x1e] = '\0';
    local_58.TypeName[0x1f] = '\0';
    local_58.TypeName[0x40] = '\0';
    local_58.TypeName[0x41] = '\0';
    local_58.TypeName[0x42] = '\0';
    local_58.TypeName[0x43] = '\0';
    local_58.TypeName[0x44] = '\0';
    local_58.TypeName[0x45] = '\0';
    local_58.TypeName[0x46] = '\0';
    local_58.TypeName[0x47] = '\0';
    local_58.TypeName[0x48] = '\0';
    local_58.TypeName[0x49] = '\0';
    local_58.TypeName[0x4a] = '\0';
    local_58.TypeName[0x4b] = '\0';
    local_58.TypeName[0x4c] = '\0';
    local_58.TypeName[0x4d] = '\0';
    local_58.TypeName[0x4e] = '\0';
    local_58.TypeName[0x4f] = '\0';
    local_58.TypeName[0x50] = '\0';
    local_58.TypeName[0x51] = '\0';
    local_58.TypeName[0x52] = '\0';
    local_58.TypeName[0x53] = '\0';
    local_58.TypeName[0x54] = '\0';
    local_58.TypeName[0x55] = '\0';
    local_58.TypeName[0x56] = '\0';
    local_58.TypeName[0x57] = '\0';
    local_58.TypeName[0x58] = '\0';
    local_58.TypeName[0x59] = '\0';
    local_58.TypeName[0x5a] = '\0';
    local_58.TypeName[0x5b] = '\0';
    local_58.TypeName[0x5c] = '\0';
    local_58.TypeName[0x5d] = '\0';
    local_58.TypeName[0x5e] = '\0';
    local_58.TypeName[0x5f] = '\0';
    local_58.TypeName[0x60] = '\0';
    local_58.TypeName[0x61] = '\0';
    local_58.TypeName[0x62] = '\0';
    local_58.TypeName[99] = '\0';
    local_58.TypeName[100] = '\0';
    local_58.TypeName[0x65] = '\0';
    local_58.TypeName[0x66] = '\0';
    local_58.TypeName[0x67] = '\0';
    local_58.TypeName[0x68] = '\0';
    local_58.TypeName[0x69] = '\0';
    local_58.TypeName[0x6a] = '\0';
    local_58.TypeName[0x6b] = '\0';
    local_58.TypeName[0x6c] = '\0';
    local_58.TypeName[0x6d] = '\0';
    local_58.TypeName[0x6e] = '\0';
    local_58.TypeName[0x6f] = '\0';
    local_58.TypeName[0x70] = '\0';
    local_58.TypeName[0x71] = '\0';
    local_58.TypeName[0x72] = '\0';
    local_58.TypeName[0x73] = '\0';
    local_58.TypeName[0x74] = '\0';
    local_58.TypeName[0x75] = '\0';
    local_58.TypeName[0x76] = '\0';
    local_58.TypeName[0x77] = '\0';
    local_58.TypeName[0x78] = '\0';
    local_58.TypeName[0x79] = '\0';
    local_58.TypeName[0x7a] = '\0';
    local_58.TypeName[0x7b] = '\0';
    local_58.TypeName[0x7c] = '\0';
    local_58.TypeName[0x7d] = '\0';
    local_58.TypeName[0x7e] = '\0';
    local_58.TypeName[0x7f] = '\0';
    local_58.TypeName[0x80] = '\0';
    local_58.TypeName[0x81] = '\0';
    local_58.TypeName[0x82] = '\0';
    local_58.TypeName[0x83] = '\0';
    local_58.TypeName[0x84] = '\0';
    local_58.TypeName[0x85] = '\0';
    local_58.TypeName[0x86] = '\0';
    local_58.TypeName[0x87] = '\0';
    local_58.TypeName[0x88] = '\0';
    local_58.TypeName[0x89] = '\0';
    local_58.TypeName[0x8a] = '\0';
    local_58.TypeName[0x8b] = '\0';
    local_58.TypeName[0x8c] = '\0';
    local_58.TypeName[0x8d] = '\0';
    local_58.TypeName[0x8e] = '\0';
    local_58.TypeName[0x8f] = '\0';
    local_58.TypeName[0x90] = '\0';
    local_58.TypeName[0x91] = '\0';
    local_58.TypeName[0x92] = '\0';
    local_58.TypeName[0x93] = '\0';
    local_58.TypeName[0x94] = '\0';
    local_58.TypeName[0x95] = '\0';
    local_58.TypeName[0x96] = '\0';
    local_58.TypeName[0x97] = '\0';
    local_58.TypeName[0x98] = '\0';
    local_58.TypeName[0x99] = '\0';
    local_58.TypeName[0x9a] = '\0';
    local_58.TypeName[0x9b] = '\0';
    local_58.TypeName[0x9c] = '\0';
    local_58.TypeName[0x9d] = '\0';
    local_58.TypeName[0x9e] = '\0';
    local_58.TypeName[0x9f] = '\0';
    local_58.TypeName[0xa0] = '\0';
    local_58.TypeName[0xa1] = '\0';
    local_58.TypeName[0xa2] = '\0';
    local_58.TypeName[0xa3] = '\0';
    local_58.TypeName[0xa4] = '\0';
    local_58.TypeName[0xa5] = '\0';
    local_58.TypeName[0xa6] = '\0';
    local_58.TypeName[0xa7] = '\0';
    local_58.TypeName[0xa8] = '\0';
    local_58.TypeName[0xa9] = '\0';
    local_58.TypeName[0xaa] = '\0';
    local_58.TypeName[0xab] = '\0';
    local_58.TypeName[0xac] = '\0';
    local_58.TypeName[0xad] = '\0';
    local_58.TypeName[0xae] = '\0';
    local_58.TypeName[0xaf] = '\0';
    local_58.TypeName[0x24] = -1;
    local_58.TypeName[0x25] = -1;
    local_58.TypeName[0x26] = -1;
    local_58.TypeName[0x27] = -1;
    local_58.TypeName[0x28] = -1;
    local_58.TypeName[0x29] = -1;
    local_58.TypeName[0x2a] = -1;
    local_58.TypeName[0x2b] = -1;
    local_58.TypeName[0x30] = '\0';
    local_58.TypeName[0x31] = '\0';
    local_58.TypeName[0x32] = '\0';
    local_58.TypeName[0x33] = '\0';
    local_58.TypeName[0x34] = '\0';
    local_58.TypeName[0x35] = '\0';
    local_58.TypeName[0x36] = '\0';
    local_58.TypeName[0x37] = '\0';
    local_58.TypeName[0x38] = '\0';
    local_58.TypeName[0x39] = '\0';
    local_58.TypeName[0x3a] = '\0';
    local_58.TypeName[0x3b] = '\0';
    local_58.TypeName[0x3c] = '\0';
    local_58.TypeName[0x3d] = '\0';
    local_58.TypeName[0x3e] = '\0';
    local_58.TypeName[0x3f] = '\0';
    ImVector<ImGuiViewportP_*>::push_back(&context->Viewports,(ImGuiViewportP **)&local_58);
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1028,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}